

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O0

cram_codec *
cram_byte_array_stop_decode_init(char *data,int size,cram_external_type option,int version)

{
  code *pcVar1;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  byte *local_38;
  uchar *cp;
  cram_codec *c;
  int version_local;
  cram_external_type option_local;
  int size_local;
  char *data_local;
  
  data_local = (char *)malloc(0x240);
  if (data_local == (char *)0x0) {
    data_local = (char *)0x0;
  }
  else {
    data_local[0] = '\x05';
    data_local[1] = '\0';
    data_local[2] = '\0';
    data_local[3] = '\0';
    pcVar1 = cram_byte_array_stop_decode_char;
    if (option == E_BYTE_ARRAY_BLOCK) {
      pcVar1 = cram_byte_array_stop_decode_block;
    }
    *(code **)(data_local + 0x18) = pcVar1;
    *(code **)(data_local + 0x10) = cram_byte_array_stop_decode_free;
    local_38 = (byte *)(data + 1);
    data_local[0x30] = *data;
    if (version >> 8 == 1) {
      *(uint *)(data_local + 0x34) =
           (uint)*local_38 + (uint)(byte)data[2] * 0x100 + (uint)(byte)data[3] * 0x10000 +
           (uint)(byte)data[4] * 0x1000000;
      local_38 = (byte *)(data + 5);
    }
    else {
      if (*local_38 < 0x80) {
        *(uint *)(data_local + 0x34) = (uint)*local_38;
        local_3c = 1;
      }
      else {
        if (*local_38 < 0xc0) {
          *(uint *)(data_local + 0x34) = CONCAT11(*local_38,data[2]) & 0x3fff;
          local_40 = 2;
        }
        else {
          if (*local_38 < 0xe0) {
            *(uint *)(data_local + 0x34) =
                 (*local_38 & 0x1f) << 0x10 | (uint)(byte)data[2] << 8 | (uint)(byte)data[3];
            local_44 = 3;
          }
          else {
            if (*local_38 < 0xf0) {
              *(uint *)(data_local + 0x34) =
                   (*local_38 & 0xf) << 0x18 | (uint)(byte)data[2] << 0x10 |
                   (uint)(byte)data[3] << 8 | (uint)(byte)data[4];
              local_48 = 4;
            }
            else {
              *(uint *)(data_local + 0x34) =
                   (uint)*local_38 << 0x1c | (uint)(byte)data[2] << 0x14 |
                   (uint)(byte)data[3] << 0xc | (uint)(byte)data[4] << 4 | (byte)data[5] & 0xf;
              local_48 = 5;
            }
            local_44 = local_48;
          }
          local_40 = local_44;
        }
        local_3c = local_40;
      }
      local_38 = local_38 + local_3c;
    }
    if ((long)local_38 - (long)data != (long)size) {
      fprintf(_stderr,"Malformed byte_array_stop header stream\n");
      free(data_local);
      data_local = (char *)0x0;
    }
  }
  return (cram_codec *)data_local;
}

Assistant:

cram_codec *cram_byte_array_stop_decode_init(char *data, int size,
					     enum cram_external_type option,
					     int version) {
    cram_codec *c;
    unsigned char *cp = (unsigned char *)data;

    if (!(c = malloc(sizeof(*c))))
	return NULL;

    c->codec  = E_BYTE_ARRAY_STOP;
    c->decode = (option == E_BYTE_ARRAY_BLOCK)
	? cram_byte_array_stop_decode_block
	: cram_byte_array_stop_decode_char;
    c->free   = cram_byte_array_stop_decode_free;
    
    c->byte_array_stop.stop = *cp++;
    if (CRAM_MAJOR_VERS(version) == 1) {
	c->byte_array_stop.content_id = cp[0] + (cp[1]<<8) + (cp[2]<<16)
	    + (cp[3]<<24);
	cp += 4;
    } else {
	cp += itf8_get(cp, &c->byte_array_stop.content_id);
    }

    if ((char *)cp - data != size) {
	fprintf(stderr, "Malformed byte_array_stop header stream\n");
	free(c);
	return NULL;
    }

    return c;
}